

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibScl.c
# Opt level: O0

int Abc_SclReadLibraryGenlib(SC_Lib *p,Mio_Library_t *pLib)

{
  int iVar1;
  Mio_PinPhase_t MVar2;
  char *pcVar3;
  SC_Cell *Entry;
  SC_Pin *pSVar4;
  word *pwVar5;
  SC_Timings *Entry_00;
  SC_Timing *Entry_01;
  double dVar6;
  SC_Timing *pTime;
  SC_Timings *pRTime;
  Mio_PinPhase_t Value;
  SC_Pin *pPin_1;
  word *pTruth;
  SC_Pin *pPin;
  SC_Cell *pCell;
  int k;
  int j;
  Mio_Pin_t *pGatePin;
  Mio_Gate_t *pGate;
  Mio_Library_t *pLib_local;
  SC_Lib *p_local;
  
  pcVar3 = Mio_LibraryReadName(pLib);
  pcVar3 = Abc_UtilStrsav(pcVar3);
  p->pName = pcVar3;
  p->default_wire_load = (char *)0x0;
  p->default_wire_load_sel = (char *)0x0;
  p->default_max_out_slew = 0.0;
  p->unit_time = 0xc;
  p->unit_cap_fst = 1.0;
  p->unit_cap_snd = 0xf;
  pGatePin = (Mio_Pin_t *)Mio_LibraryReadGates(pLib);
  do {
    if (pGatePin == (Mio_Pin_t *)0x0) {
      return 1;
    }
    Entry = Abc_SclCellAlloc();
    iVar1 = SC_LibCellNum(p);
    Entry->Id = iVar1;
    Vec_PtrPush(&p->vCells,Entry);
    pcVar3 = Mio_GateReadName((Mio_Gate_t *)pGatePin);
    pcVar3 = Abc_UtilStrsav(pcVar3);
    Entry->pName = pcVar3;
    dVar6 = Mio_GateReadArea((Mio_Gate_t *)pGatePin);
    Entry->area = (float)dVar6;
    Entry->leakage = 0.0;
    Entry->drive_strength = 0;
    iVar1 = Mio_GateReadPinNum((Mio_Gate_t *)pGatePin);
    Entry->n_inputs = iVar1;
    Entry->n_outputs = 1;
    iVar1 = Scl_Flt2Int(Entry->area);
    Entry->areaI = iVar1;
    iVar1 = Scl_Flt2Int(Entry->leakage);
    Entry->leakageI = iVar1;
    for (_k = Mio_GateReadPins((Mio_Gate_t *)pGatePin); _k != (Mio_Pin_t *)0x0;
        _k = Mio_PinReadNext(_k)) {
      pSVar4 = Abc_SclPinAlloc();
      Vec_PtrPush(&Entry->vPins,pSVar4);
      pSVar4->dir = sc_dir_Input;
      pcVar3 = Mio_PinReadName(_k);
      pcVar3 = Abc_UtilStrsav(pcVar3);
      pSVar4->pName = pcVar3;
      pSVar4->rise_cap = 0.0;
      pSVar4->fall_cap = 0.0;
      iVar1 = Scl_Flt2Int(pSVar4->rise_cap);
      pSVar4->rise_capI = iVar1;
      iVar1 = Scl_Flt2Int(pSVar4->fall_cap);
      pSVar4->fall_capI = iVar1;
    }
    for (pCell._4_4_ = 0; pCell._4_4_ < Entry->n_outputs; pCell._4_4_ = pCell._4_4_ + 1) {
      pwVar5 = Mio_GateReadTruthP((Mio_Gate_t *)pGatePin);
      pSVar4 = Abc_SclPinAlloc();
      Vec_PtrPush(&Entry->vPins,pSVar4);
      pSVar4->dir = sc_dir_Output;
      pcVar3 = Mio_GateReadOutName((Mio_Gate_t *)pGatePin);
      pcVar3 = Abc_UtilStrsav(pcVar3);
      pSVar4->pName = pcVar3;
      pSVar4->max_out_cap = 0.0;
      pSVar4->max_out_slew = 0.0;
      pcVar3 = Mio_GateReadForm((Mio_Gate_t *)pGatePin);
      pcVar3 = Abc_UtilStrsav(pcVar3);
      pSVar4->func_text = pcVar3;
      iVar1 = Abc_Truth6WordNum(Entry->n_inputs);
      Vec_WrdGrow(&pSVar4->vFunc,iVar1);
      for (pCell._0_4_ = 0; iVar1 = Vec_WrdCap(&pSVar4->vFunc), (int)pCell < iVar1;
          pCell._0_4_ = (int)pCell + 1) {
        Vec_WrdPush(&pSVar4->vFunc,pwVar5[(int)pCell]);
      }
      for (_k = Mio_GateReadPins((Mio_Gate_t *)pGatePin); _k != (Mio_Pin_t *)0x0;
          _k = Mio_PinReadNext(_k)) {
        MVar2 = Mio_PinReadPhase(_k);
        Entry_00 = Abc_SclTimingsAlloc();
        Vec_PtrPush(&pSVar4->vRTimings,Entry_00);
        pcVar3 = Mio_PinReadName(_k);
        pcVar3 = Abc_UtilStrsav(pcVar3);
        Entry_00->pName = pcVar3;
        Entry_01 = Abc_SclTimingAlloc();
        Vec_PtrPush(&Entry_00->vTimings,Entry_01);
        if (MVar2 == MIO_PHASE_UNKNOWN) {
          Entry_01->tsense = sc_ts_Non;
        }
        else if (MVar2 == MIO_PHASE_INV) {
          Entry_01->tsense = sc_ts_Neg;
        }
        else {
          if (MVar2 != MIO_PHASE_NONINV) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclLibScl.c"
                          ,0x9e,"int Abc_SclReadLibraryGenlib(SC_Lib *, Mio_Library_t *)");
          }
          Entry_01->tsense = sc_ts_Pos;
        }
        Abc_SclReadSurfaceGenlib(&Entry_01->pCellRise);
        Abc_SclReadSurfaceGenlib(&Entry_01->pCellFall);
        Abc_SclReadSurfaceGenlib(&Entry_01->pRiseTrans);
        Abc_SclReadSurfaceGenlib(&Entry_01->pFallTrans);
      }
    }
    pGatePin = (Mio_Pin_t *)Mio_GateReadNext((Mio_Gate_t *)pGatePin);
  } while( true );
}

Assistant:

static int Abc_SclReadLibraryGenlib( SC_Lib * p, Mio_Library_t * pLib )
{
    Mio_Gate_t * pGate;
    Mio_Pin_t * pGatePin;
    int j, k;

    // Read non-composite fields:
    p->pName                 = Abc_UtilStrsav( Mio_LibraryReadName(pLib) );
    p->default_wire_load     = 0;
    p->default_wire_load_sel = 0;
    p->default_max_out_slew  = 0;

    p->unit_time             = 12;
    p->unit_cap_fst          = 1.0;
    p->unit_cap_snd          = 15;

    Mio_LibraryForEachGate( pLib, pGate )
    {
        SC_Cell * pCell = Abc_SclCellAlloc();
        pCell->Id = SC_LibCellNum(p);
        Vec_PtrPush( &p->vCells, pCell );

        pCell->pName          = Abc_UtilStrsav( Mio_GateReadName( pGate ) );     
        pCell->area           = Mio_GateReadArea( pGate );
        pCell->leakage        = 0;
        pCell->drive_strength = 0;

        pCell->n_inputs       = Mio_GateReadPinNum( pGate );    
        pCell->n_outputs      = 1;

        pCell->areaI          = Scl_Flt2Int(pCell->area);
        pCell->leakageI       = Scl_Flt2Int(pCell->leakage);

        Mio_GateForEachPin( pGate, pGatePin )
        {
            SC_Pin * pPin = Abc_SclPinAlloc();
            Vec_PtrPush( &pCell->vPins, pPin );

            pPin->dir      = sc_dir_Input;
            pPin->pName    = Abc_UtilStrsav( Mio_PinReadName( pGatePin ) ); 
            pPin->rise_cap = 0;
            pPin->fall_cap = 0;

            pPin->rise_capI = Scl_Flt2Int(pPin->rise_cap);
            pPin->fall_capI = Scl_Flt2Int(pPin->fall_cap);
        }

        for ( j = 0; j < pCell->n_outputs; j++ )
        {
            word * pTruth = Mio_GateReadTruthP( pGate );
            SC_Pin * pPin = Abc_SclPinAlloc();
            Vec_PtrPush( &pCell->vPins, pPin );

            pPin->dir          = sc_dir_Output;
            pPin->pName        = Abc_UtilStrsav( Mio_GateReadOutName( pGate ) );
            pPin->max_out_cap  = 0;
            pPin->max_out_slew = 0;

            // read function
            pPin->func_text = Abc_UtilStrsav( Mio_GateReadForm( pGate ) );
            Vec_WrdGrow( &pPin->vFunc, Abc_Truth6WordNum(pCell->n_inputs) );
            for ( k = 0; k < Vec_WrdCap(&pPin->vFunc); k++ )
                Vec_WrdPush( &pPin->vFunc, pTruth[k] );

            // read pins
            Mio_GateForEachPin( pGate, pGatePin )
            {
                Mio_PinPhase_t Value = Mio_PinReadPhase( pGatePin );
                SC_Timings * pRTime = Abc_SclTimingsAlloc();
                Vec_PtrPush( &pPin->vRTimings, pRTime );
                pRTime->pName = Abc_UtilStrsav( Mio_PinReadName( pGatePin ) ); 
                if ( 1 )
                {
                    SC_Timing * pTime = Abc_SclTimingAlloc();
                    Vec_PtrPush( &pRTime->vTimings, pTime );
                    if ( Value == MIO_PHASE_UNKNOWN )
                        pTime->tsense = (SC_TSense)sc_ts_Non;
                    else if ( Value == MIO_PHASE_INV )
                        pTime->tsense = (SC_TSense)sc_ts_Neg;
                    else if ( Value == MIO_PHASE_NONINV )
                        pTime->tsense = (SC_TSense)sc_ts_Pos;
                    else assert( 0 );
                    Abc_SclReadSurfaceGenlib( &pTime->pCellRise );
                    Abc_SclReadSurfaceGenlib( &pTime->pCellFall );
                    Abc_SclReadSurfaceGenlib( &pTime->pRiseTrans );
                    Abc_SclReadSurfaceGenlib( &pTime->pFallTrans );
                }
            }
        }
    }
    return 1;
}